

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

Variable __thiscall
LiteScript::CreateNamespace(LiteScript *this,Memory *memory,int count,char **names,Variable *values)

{
  Namespace *this_00;
  Object *pOVar1;
  uint *extraout_RDX;
  uint *puVar2;
  uint *extraout_RDX_00;
  ulong uVar3;
  Variable VVar4;
  
  Memory::Create((Memory *)this,(Type *)memory);
  pOVar1 = Variable::operator->((Variable *)this);
  this_00 = (Namespace *)pOVar1->data;
  puVar2 = extraout_RDX;
  for (uVar3 = 0; (uint)count != uVar3; uVar3 = uVar3 + 1) {
    Namespace::DefineVariable(this_00,names[uVar3],values);
    values = values + 1;
    puVar2 = extraout_RDX_00;
  }
  VVar4.nb_ref = puVar2;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::CreateNamespace(Memory &memory, int count, const char **names, const Variable *values) {
    Variable v = memory.Create(Type::NAMESPACE);
    Namespace& n = v->GetData<Namespace>();
    for (unsigned int i = 0, sz = (unsigned int)count; i < sz; i++)
        n.DefineVariable(names[i], values[i]);
    return v;
}